

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
TasGrid::GridSequence::cacheBasisIntegrals
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,GridSequence *this)

{
  pointer *this_00;
  double dVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  int m;
  const_reference pvVar5;
  reference piVar6;
  reference pvVar7;
  const_reference pvVar8;
  int local_a4;
  double dStack_a0;
  int j;
  double v;
  undefined1 local_90 [4];
  int i;
  vector<double,_std::allocator<double>_> lag_w;
  vector<double,_std::allocator<double>_> lag_x;
  int n;
  allocator<double> local_49;
  value_type_conflict2 local_48;
  byte local_3d;
  int local_3c;
  const_iterator cStack_38;
  int l;
  const_iterator __end1;
  const_iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  int max_level;
  GridSequence *this_local;
  vector<double,_std::allocator<double>_> *integ;
  
  pvVar5 = ::std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&this->max_levels,0);
  __range1._4_4_ = *pvVar5;
  __end1._M_current =
       (int *)::std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)&this->max_levels);
  cStack_38 = ::std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)&this->max_levels);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffc8);
    if (!bVar3) break;
    piVar6 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&__end1);
    local_3c = *piVar6;
    if (__range1._4_4_ < local_3c) {
      __range1._4_4_ = local_3c;
    }
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  local_3d = 0;
  iVar4 = __range1._4_4_ + 1;
  local_48 = 0.0;
  ::std::allocator<double>::allocator(&local_49);
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)__return_storage_ptr__,(long)iVar4,&local_48
             ,&local_49);
  ::std::allocator<double>::~allocator(&local_49);
  m = iVar4 / 2 + 1;
  this_00 = &lag_w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)this_00);
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_90);
  OneDimensionalNodes::getGaussLegendre
            (m,(vector<double,_std::allocator<double>_> *)local_90,
             (vector<double,_std::allocator<double>_> *)this_00);
  for (v._4_4_ = 0; v._4_4_ < m; v._4_4_ = v._4_4_ + 1) {
    dStack_a0 = 1.0;
    for (local_a4 = 1; local_a4 < iVar4; local_a4 = local_a4 + 1) {
      pvVar7 = ::std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &lag_w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(long)v._4_4_);
      dVar1 = *pvVar7;
      pvVar8 = ::std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)&this->nodes,
                          (long)(local_a4 + -1));
      dStack_a0 = (dVar1 - *pvVar8) * dStack_a0;
      pvVar7 = ::std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_90,(long)v._4_4_);
      dVar1 = *pvVar7;
      pvVar8 = ::std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)&this->coeff,(long)local_a4);
      dVar2 = *pvVar8;
      pvVar7 = ::std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)__return_storage_ptr__,
                          (long)local_a4);
      *pvVar7 = (dVar1 * dStack_a0) / dVar2 + *pvVar7;
    }
  }
  pvVar7 = ::std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)__return_storage_ptr__,0);
  *pvVar7 = 2.0;
  local_3d = 1;
  ::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_90);
  ::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &lag_w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if ((local_3d & 1) == 0) {
    ::std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> GridSequence::cacheBasisIntegrals() const{
    int max_level = max_levels[0];

    for(auto l: max_levels) if (max_level < l) max_level = l;

    std::vector<double> integ(++max_level, 0.0); // integrals of basis functions

    int n = 1 + max_level / 2; // number of Gauss-Legendre points needed to integrate the basis functions
    std::vector<double> lag_x, lag_w;
    OneDimensionalNodes::getGaussLegendre(n, lag_w, lag_x);

    for(int i=0; i<n; i++){
        double v = 1.0;
        for(int j=1; j<max_level; j++){
            v *= (lag_x[i] - nodes[j-1]);
            integ[j] += lag_w[i] * v / coeff[j];
        }
    }
    integ[0] = 2.0;
    return integ;
}